

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_time.c
# Opt level: O0

int pt_time_adjust_cyc(uint64_t *cyc,pt_time *time,pt_config *config,uint64_t fcr)

{
  ulong uVar1;
  int errcode;
  uint64_t old_cyc;
  uint64_t total_cyc;
  uint64_t fc;
  uint32_t local_38;
  uint32_t ctc_delta;
  uint32_t ctc;
  uint32_t last_ctc;
  uint64_t fcr_local;
  pt_config *config_local;
  pt_time *time_local;
  uint64_t *cyc_local;
  
  if (((time == (pt_time *)0x0) || (config == (pt_config *)0x0)) || (fcr == 0)) {
    cyc_local._4_4_ = -1;
  }
  else {
    ctc_delta = time->ctc_cyc;
    local_38 = time->ctc;
    if (local_38 == ctc_delta) {
      cyc_local._4_4_ = 0;
    }
    else {
      _ctc = fcr;
      fcr_local = (uint64_t)config;
      config_local = (pt_config *)time;
      time_local = (pt_time *)cyc;
      cyc_local._4_4_ = pt_time_ctc_delta((uint32_t *)((long)&fc + 4),local_38,ctc_delta,config);
      if ((-1 < cyc_local._4_4_) &&
         (cyc_local._4_4_ = pt_time_ctc_fc(&total_cyc,(ulong)fc._4_4_,(pt_config *)fcr_local),
         -1 < cyc_local._4_4_)) {
        uVar1 = (total_cyc << 8) / _ctc;
        old_cyc = time_local->tsc;
        if (time_local->tsc < uVar1) {
          old_cyc = uVar1;
        }
        time_local->tsc = old_cyc - uVar1;
        cyc_local._4_4_ = 0;
      }
    }
  }
  return cyc_local._4_4_;
}

Assistant:

static int pt_time_adjust_cyc(uint64_t *cyc, const struct pt_time *time,
			      const struct pt_config *config, uint64_t fcr)
{
	uint32_t last_ctc, ctc, ctc_delta;
	uint64_t fc, total_cyc, old_cyc;
	int errcode;

	if (!time || !config || !fcr)
		return -pte_internal;

	last_ctc = time->ctc_cyc;
	ctc = time->ctc;

	/* There is nothing to do if this is the current MTC period. */
	if (ctc == last_ctc)
		return 0;

	/* Calibration computes
	 *
	 *   fc  = (ctc_delta * cpuid[0x15].ebx) / cpuid[0x15].eax.
	 *   fcr = (fc << pt_tcal_fcr_shr) / cyc
	 *
	 * So cyc = (fc << pt_tcal_fcr_shr) / fcr.
	 */

	errcode = pt_time_ctc_delta(&ctc_delta, ctc, last_ctc, config);
	if (errcode < 0)
		return errcode;

	errcode = pt_time_ctc_fc(&fc, ctc_delta, config);
	if (errcode < 0)
		return errcode;

	old_cyc = (fc << pt_tcal_fcr_shr) / fcr;
	total_cyc = *cyc;

	/* Make sure we don't wrap around.  If we would, attribute the entire
	 * CYC payload to any previous MTC period.
	 *
	 * We lost an unknown portion of the CYC payload for the current MTC
	 * period, but it's usually better to run too slow than too fast.
	 */
	if (total_cyc < old_cyc)
		total_cyc = old_cyc;

	*cyc = total_cyc - old_cyc;
	return 0;
}